

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Cart_map(MPIABI_Comm comm,int ndims,int *dims,int *periods,int *newrank)

{
  int iVar1;
  ompi_communicator_t *poVar2;
  WPI_Handle<ompi_communicator_t_*> local_38;
  int *local_30;
  int *newrank_local;
  int *periods_local;
  int *dims_local;
  MPIABI_Comm MStack_10;
  int ndims_local;
  MPIABI_Comm comm_local;
  
  local_30 = newrank;
  newrank_local = periods;
  periods_local = dims;
  dims_local._4_4_ = ndims;
  MStack_10 = comm;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_38,comm);
  poVar2 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_38);
  iVar1 = MPI_Cart_map(poVar2,dims_local._4_4_,periods_local,newrank_local,local_30);
  return iVar1;
}

Assistant:

int MPIABI_Cart_map(
  MPIABI_Comm comm,
  int ndims,
  const int * dims,
  const int * periods,
  int * newrank
) {
  return MPI_Cart_map(
    (MPI_Comm)(WPI_Comm)comm,
    ndims,
    dims,
    periods,
    newrank
  );
}